

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSemi.c
# Opt level: O0

int Ssw_ManFilterBmc(Ssw_Sem_t *pBmc,int iPat,int fCheckTargets)

{
  Ssw_Man_t *p_00;
  Vec_Ptr_t *p_01;
  Ssw_Sat_t *p_02;
  bool bVar1;
  int iVar2;
  abctime aVar3;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  uint *p_03;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  abctime aVar7;
  abctime clk;
  int fFirst;
  int RetValue;
  int f;
  int i;
  uint *pInfo;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p;
  int fCheckTargets_local;
  int iPat_local;
  Ssw_Sem_t *pBmc_local;
  
  p_00 = pBmc->pMan;
  bVar1 = false;
  aVar3 = Abc_Clock();
  iVar2 = Aig_ManObjNumMax(p_00->pAig);
  pAVar4 = Aig_ManStart(iVar2 * 3);
  p_00->pFrames = pAVar4;
  for (RetValue = 0; iVar2 = Saig_ManRegNum(p_00->pAig), RetValue < iVar2; RetValue = RetValue + 1)
  {
    p_01 = p_00->pAig->vCis;
    iVar2 = Saig_ManPiNum(p_00->pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_01,RetValue + iVar2);
    p_03 = (uint *)Vec_PtrEntry(pBmc->vPatterns,RetValue);
    pAVar6 = Aig_ManConst1(p_00->pFrames);
    iVar2 = Abc_InfoHasBit(p_03,iPat);
    pAVar6 = Aig_NotCond(pAVar6,(uint)((iVar2 != 0 ^ 0xffU) & 1));
    Ssw_ObjSetFrame(p_00,pAVar5,0,pAVar6);
  }
  clk._4_4_ = pBmc->nFramesSweep;
  fFirst = 0;
  do {
    if (pBmc->nFramesSweep <= fFirst) {
LAB_00812254:
      if (bVar1) {
        pBmc->nConfMax = pBmc->nConfMax / 10;
      }
      Ssw_ClassesCheck(p_00->ppClasses);
      aVar7 = Abc_Clock();
      p_00->timeBmc = (aVar7 - aVar3) + p_00->timeBmc;
      return clk._4_4_;
    }
    pAVar5 = Aig_ManConst1(p_00->pAig);
    pAVar6 = Aig_ManConst1(p_00->pFrames);
    Ssw_ObjSetFrame(p_00,pAVar5,fFirst,pAVar6);
    for (RetValue = 0; iVar2 = Saig_ManPiNum(p_00->pAig), RetValue < iVar2; RetValue = RetValue + 1)
    {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00->pAig->vCis,RetValue);
      pAVar6 = Aig_ObjCreateCi(p_00->pFrames);
      Ssw_ObjSetFrame(p_00,pAVar5,fFirst,pAVar6);
    }
    for (RetValue = 0; iVar2 = Vec_PtrSize(p_00->pAig->vObjs), RetValue < iVar2;
        RetValue = RetValue + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00->pAig->vObjs,RetValue);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
        pAVar4 = p_00->pFrames;
        pAVar6 = Ssw_ObjChild0Fra(p_00,pAVar5,fFirst);
        p1 = Ssw_ObjChild1Fra(p_00,pAVar5,fFirst);
        pAVar6 = Aig_And(pAVar4,pAVar6,p1);
        Ssw_ObjSetFrame(p_00,pAVar5,fFirst,pAVar6);
        iVar2 = Ssw_ManSweepNode(p_00,pAVar5,fFirst,1,(Vec_Int_t *)0x0);
        if ((iVar2 != 0) && (Ssw_ManFilterBmcSavePattern(pBmc), !bVar1)) {
          bVar1 = true;
          pBmc->nConfMax = pBmc->nConfMax * 10;
        }
        if ((0 < fFirst) && ((long)pBmc->nConfMax <= (p_00->pMSat->pSat->stats).conflicts)) {
          clk._4_4_ = -1;
          break;
        }
      }
    }
    if ((long)pBmc->nConfMax <= (p_00->pMSat->pSat->stats).conflicts) {
      clk._4_4_ = fFirst + 1 + clk._4_4_;
      goto LAB_00812254;
    }
    if ((fCheckTargets != 0) && (iVar2 = Ssw_SemCheckTargets(pBmc), iVar2 != 0)) goto LAB_00812254;
    for (RetValue = 0; iVar2 = Saig_ManRegNum(p_00->pAig), RetValue < iVar2; RetValue = RetValue + 1
        ) {
      pAVar5 = Saig_ManLi(p_00->pAig,RetValue);
      pAVar6 = Saig_ManLo(p_00->pAig,RetValue);
      pAVar5 = Ssw_ObjChild0Fra(p_00,pAVar5,fFirst);
      Ssw_ObjSetFrame(p_00,pAVar6,fFirst + 1,pAVar5);
      p_02 = p_00->pMSat;
      pAVar5 = Aig_Regular(pAVar5);
      Ssw_CnfNodeAddToSolver(p_02,pAVar5);
    }
    fFirst = fFirst + 1;
  } while( true );
}

Assistant:

int Ssw_ManFilterBmc( Ssw_Sem_t * pBmc, int iPat, int fCheckTargets )
{
    Ssw_Man_t * p = pBmc->pMan;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    unsigned * pInfo;
    int i, f, RetValue, fFirst = 0;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * 3 );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( pBmc->vPatterns, i );
        pObjNew = Aig_NotCond( Aig_ManConst1(p->pFrames), !Abc_InfoHasBit(pInfo, iPat) );
        Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
    }

    // sweep internal nodes
    RetValue = pBmc->nFramesSweep;
    for ( f = 0; f < pBmc->nFramesSweep; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            if ( Ssw_ManSweepNode( p, pObj, f, 1, NULL ) )
            {
                Ssw_ManFilterBmcSavePattern( pBmc );
                if ( fFirst == 0 )
                {
                    fFirst = 1;
                    pBmc->nConfMax *= 10;
                }
            }
            if ( f > 0 && p->pMSat->pSat->stats.conflicts >= pBmc->nConfMax )
            {
                RetValue = -1;
                break;
            }
        }
        // quit if this is the last timeframe
        if ( p->pMSat->pSat->stats.conflicts >= pBmc->nConfMax )
        {
            RetValue += f + 1;
            break;
        }
        if ( fCheckTargets && Ssw_SemCheckTargets( pBmc ) )
            break;
        // transfer latch input to the latch outputs 
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjChild0Fra(p, pObjLi,f);
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );
        }
//Abc_Print( 1, "Frame %2d : Conflicts = %6d. \n", f, p->pSat->stats.conflicts );
    }
    if ( fFirst )
        pBmc->nConfMax /= 10;

    // cleanup
    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return RetValue;
}